

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O3

int __kmp_api_omp_get_level_(void)

{
  int iVar1;
  
  iVar1 = __kmp_get_global_thread_id_reg();
  return (((__kmp_threads[iVar1]->th).th_team)->t).t_level;
}

Assistant:

int FTN_STDCALL KMP_EXPAND_NAME(FTN_GET_LEVEL)(void) {
#ifdef KMP_STUB
  return 0; // returns 0 if it is called from the sequential part of the program
#else
  /* TO DO: For the per-task implementation of the internal controls */
  return __kmp_entry_thread()->th.th_team->t.t_level;
#endif
}